

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkdetheme.cpp
# Opt level: O3

QPlatformTheme * QKdeTheme::createKdeTheme(void)

{
  char **ppcVar1;
  char cVar2;
  int kdeVersion;
  QPlatformTheme *this;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String> *this_00;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QAnyStringView QVar4;
  QArrayDataPointer<QString> local_188;
  undefined1 *local_168;
  undefined1 *puStack_160;
  QString local_158;
  QString local_138;
  QString local_118;
  QArrayData *local_f8;
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  QString local_d8;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String> local_b8;
  QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String> local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppcVar1 = &local_b8.a.b.m_data;
  local_b8.b.m_data = &DAT_aaaaaaaaaaaaaaaa;
  local_b8.a.b.m_data = &DAT_aaaaaaaaaaaaaaaa;
  local_b8.b.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  qgetenv((char *)ppcVar1);
  this = (QPlatformTheme *)0x0;
  kdeVersion = QByteArray::toInt((bool *)ppcVar1,0);
  if (3 < kdeVersion) {
    if (kdeVersion == 4) {
      local_b8.a.a.d.d = (Data *)0x0;
      local_b8.a.a.d.ptr = (char16_t *)0x0;
      local_b8.a.a.d.size = 0;
      local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      qEnvironmentVariable((char *)&local_d8);
      if ((undefined1 *)local_d8.d.size != (undefined1 *)0x0) {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&local_b8,local_b8.a.a.d.size,&local_d8);
        QList<QString>::end((QList<QString> *)&local_b8);
      }
      local_e8 = &DAT_aaaaaaaaaaaaaaaa;
      local_f8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
      qEnvironmentVariable((char *)&local_f8);
      if (local_e8 != (undefined1 *)0x0) {
        QString::split(&local_78,&local_f8,0x3a,1,1);
        QList<QString>::operator+=((QList<QString> *)&local_b8,(QList<QString> *)&local_78);
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
      }
      local_118.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_118.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QDir::homePath();
      local_78.a.a.d.size = local_138.d.size;
      local_78.a.a.d.ptr = local_138.d.ptr;
      local_78.a.a.d.d = local_138.d.d;
      local_138.d.size = 0;
      local_138.d.d = (Data *)0x0;
      local_138.d.ptr = (char16_t *)0x0;
      local_78.a.b.m_size = (qsizetype)&DAT_00000005;
      local_78.a.b.m_data = "/.kde";
      local_78.b.m_size = (qsizetype)local_b8.b.m_data;
      local_78.b.m_data = (char *)local_b8.b.m_size;
      QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>::convertTo<QString>
                (&local_118,&local_78);
      if (&(local_78.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
        ;
        UNLOCK();
        if (((local_78.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_78.a.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
        }
      }
      QFileInfo::QFileInfo((QFileInfo *)&local_78,(QString *)&local_118);
      cVar2 = QFileInfo::isDir();
      QFileInfo::~QFileInfo((QFileInfo *)&local_78);
      if (cVar2 != '\0') {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&local_b8,local_b8.a.a.d.size,&local_118);
        QList<QString>::end((QList<QString> *)&local_b8);
      }
      local_138.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_138.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_138.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QDir::homePath();
      local_78.a.a.d.size = local_158.d.size;
      local_78.a.a.d.ptr = local_158.d.ptr;
      local_78.a.a.d.d = local_158.d.d;
      local_158.d.d = (Data *)0x0;
      local_158.d.ptr = (char16_t *)0x0;
      local_158.d.size = 0;
      local_78.a.b.m_size = (qsizetype)&DAT_00000005;
      local_78.a.b.m_data = "/.kde";
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>(&local_138,&local_78.a);
      if (&(local_78.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
        ;
        UNLOCK();
        if (((local_78.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_78.a.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,0x10);
        }
      }
      QFileInfo::QFileInfo((QFileInfo *)&local_78,(QString *)&local_138);
      cVar2 = QFileInfo::isDir();
      QFileInfo::~QFileInfo((QFileInfo *)&local_78);
      if (cVar2 != '\0') {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&local_b8,local_b8.a.a.d.size,&local_138);
        QList<QString>::end((QList<QString> *)&local_b8);
      }
      local_158.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_158.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.a.a.d.d = (Data *)&DAT_00000008;
      local_78.a.a.d.ptr = L"/etc/kde";
      local_78.a.a.d.size = (qsizetype)local_b8.b.m_data;
      local_78.a.b.m_size = local_b8.b.m_size;
      local_78.a.b.m_data = (char *)0x2;
      local_78.b.m_size = 0x6af892;
      QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_QLatin1String>::
      convertTo<QString>(&local_158,
                         (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_QLatin1String>
                          *)&local_78);
      QFileInfo::QFileInfo((QFileInfo *)&local_78,(QString *)&local_158);
      cVar2 = QFileInfo::isReadable();
      QFileInfo::~QFileInfo((QFileInfo *)&local_78);
      if (cVar2 != '\0') {
        local_168 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_160 = &DAT_aaaaaaaaaaaaaaaa;
        QSettings::QSettings((QSettings *)&local_168,(QString *)&local_158,IniFormat,(QObject *)0x0)
        ;
        QVar3.m_size = (size_t)L"Directories-default";
        QVar3.field_0.m_data_utf8 = (char *)&local_168;
        QSettings::beginGroup(QVar3);
        QVar4.m_size = (size_t)&local_168;
        QVar4.field_0.m_data = &local_78;
        QSettings::value(QVar4);
        ::QVariant::toStringList();
        QList<QString>::operator+=((QList<QString> *)&local_b8,(QList<QString> *)&local_188);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_188);
        ::QVariant::~QVariant((QVariant *)&local_78);
        QSettings::~QSettings((QSettings *)&local_168);
      }
      local_188.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_188.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_188.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.a.a.d.d = (Data *)&DAT_00000008;
      local_78.a.a.d.ptr = L"/etc/kde";
      local_78.a.a.d.size = (qsizetype)local_b8.b.m_data;
      local_78.a.b.m_size = local_b8.b.m_size;
      QStringBuilder<QLatin1String,_QLatin1String>::convertTo<QString>
                ((QString *)&local_188,(QStringBuilder<QLatin1String,_QLatin1String> *)&local_78);
      QFileInfo::QFileInfo((QFileInfo *)&local_78,(QString *)&local_188);
      cVar2 = QFileInfo::isDir();
      QFileInfo::~QFileInfo((QFileInfo *)&local_78);
      if (cVar2 != '\0') {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&local_b8,local_b8.a.a.d.size,(QString *)&local_188)
        ;
        QList<QString>::end((QList<QString> *)&local_b8);
      }
      QtPrivate::QStringList_removeDuplicates((QList_conflict *)&local_b8);
      if (local_b8.a.a.d.size == 0) {
        createKdeTheme();
        this = (QPlatformTheme *)0x0;
      }
      else {
        this = (QPlatformTheme *)operator_new(0x10);
        QKdeTheme((QKdeTheme *)this,(QStringList *)&local_b8,4);
      }
      if (&(local_188.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_188.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_188.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_188.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_188.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_f8 != (QArrayData *)0x0) {
        LOCK();
        (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_f8,2,0x10);
        }
      }
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
        }
      }
      this_00 = &local_b8;
    }
    else {
      this = (QPlatformTheme *)operator_new(0x10);
      this_00 = &local_78;
      QStandardPaths::standardLocations((StandardLocation)this_00);
      QKdeTheme((QKdeTheme *)this,(QStringList *)this_00,kdeVersion);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)this_00);
  }
  if ((QArrayData *)local_b8.a.b.m_data != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8.a.b.m_data)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8.a.b.m_data)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8.a.b.m_data)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8.a.b.m_data,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformTheme *QKdeTheme::createKdeTheme()
{
    const QByteArray kdeVersionBA = qgetenv("KDE_SESSION_VERSION");
    const int kdeVersion = kdeVersionBA.toInt();
    if (kdeVersion < 4)
        return nullptr;

    if (kdeVersion > 4)
        // Plasma 5 follows XDG spec
        // but uses the same config file format:
        return new QKdeTheme(QStandardPaths::standardLocations(QStandardPaths::GenericConfigLocation), kdeVersion);

    // Determine KDE prefixes in the following priority order:
    // - KDEHOME and KDEDIRS environment variables
    // - ~/.kde(<version>)
    // - read prefixes from /etc/kde<version>rc
    // - fallback to /etc/kde<version>

    QStringList kdeDirs;
    const QString kdeHomePathVar = qEnvironmentVariable("KDEHOME");
    if (!kdeHomePathVar.isEmpty())
        kdeDirs += kdeHomePathVar;

    const QString kdeDirsVar = qEnvironmentVariable("KDEDIRS");
    if (!kdeDirsVar.isEmpty())
        kdeDirs += kdeDirsVar.split(u':', Qt::SkipEmptyParts);

    const QString kdeVersionHomePath = QDir::homePath() + "/.kde"_L1 + QLatin1StringView(kdeVersionBA);
    if (QFileInfo(kdeVersionHomePath).isDir())
        kdeDirs += kdeVersionHomePath;

    const QString kdeHomePath = QDir::homePath() + "/.kde"_L1;
    if (QFileInfo(kdeHomePath).isDir())
        kdeDirs += kdeHomePath;

    const QString kdeRcPath = "/etc/kde"_L1 + QLatin1StringView(kdeVersionBA) + "rc"_L1;
    if (QFileInfo(kdeRcPath).isReadable()) {
        QSettings kdeSettings(kdeRcPath, QSettings::IniFormat);
        kdeSettings.beginGroup(QStringLiteral("Directories-default"));
        kdeDirs += kdeSettings.value(QStringLiteral("prefixes")).toStringList();
    }

    const QString kdeVersionPrefix = "/etc/kde"_L1 + QLatin1StringView(kdeVersionBA);
    if (QFileInfo(kdeVersionPrefix).isDir())
        kdeDirs += kdeVersionPrefix;

    kdeDirs.removeDuplicates();
    if (kdeDirs.isEmpty()) {
        qWarning("Unable to determine KDE dirs");
        return nullptr;
    }

    return new QKdeTheme(kdeDirs, kdeVersion);
}